

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OoutReportTextTest.cpp
# Opt level: O3

void __thiscall OoutReportTextTest::OoutReportTextTest(OoutReportTextTest *this)

{
  undefined1 local_201;
  shared_ptr<oout::ContainMatch> local_200;
  shared_ptr<oout::ContainMatch> local_1f0;
  shared_ptr<oout::ContainMatch> local_1e0;
  shared_ptr<oout::ContainMatch> local_1d0;
  shared_ptr<oout::NamedTest> local_1c0;
  shared_ptr<oout::NamedTest> local_1b0;
  shared_ptr<oout::NamedTest> local_1a0;
  shared_ptr<oout::ErrorResult> local_190;
  shared_ptr<oout::TestResult> local_180;
  shared_ptr<oout::NamedResult> local_170;
  shared_ptr<oout::SuiteResult> local_160;
  shared_ptr<oout::OoutReportText> local_150;
  shared_ptr<oout::ContainMatch> local_140;
  shared_ptr<oout::ContainMatch> local_130;
  shared_ptr<oout::ErrorResult> local_120;
  shared_ptr<oout::TestResult> local_110;
  shared_ptr<oout::NamedResult> local_100;
  shared_ptr<oout::OoutReportText> local_f0;
  shared_ptr<oout::ContainMatch> local_e0;
  shared_ptr<oout::ContainMatch> local_d0;
  shared_ptr<oout::FailureResult> local_c0;
  shared_ptr<oout::TestResult> local_b0;
  shared_ptr<oout::NamedResult> local_a0;
  shared_ptr<oout::OoutReportText> local_90;
  shared_ptr<oout::SuccessResult> local_80;
  shared_ptr<oout::TestResult> local_70;
  shared_ptr<oout::OoutReportText> local_60;
  shared_ptr<oout::NamedTest> local_50;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"OoutReportText tests","");
  local_80.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuccessResult,std::allocator<oout::SuccessResult>>
            (&local_80.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SuccessResult **)&local_80,(allocator<oout::SuccessResult> *)&local_1d0);
  local_70.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::SuccessResult>>
            (&local_70.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestResult **)&local_70,(allocator<oout::TestResult> *)&local_1d0,&local_80);
  local_60.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::OoutReportText,std::allocator<oout::OoutReportText>,std::shared_ptr<oout::TestResult>>
            (&local_60.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(OoutReportText **)&local_60,(allocator<oout::OoutReportText> *)&local_1d0
             ,&local_70);
  local_1d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[20]>
            (&local_1d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_1d0,(allocator<oout::ContainMatch> *)&local_1a0,
             (char (*) [20])"0 of 1 tests failed");
  local_50.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[42],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>>
            (&local_50.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_50,(allocator<oout::NamedTest> *)&local_1a0,
             (char (*) [42])"OoutReportText should show summary string",&local_60,&local_1d0);
  local_c0.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::FailureResult,std::allocator<oout::FailureResult>,char_const(&)[8]>
            (&local_c0.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FailureResult **)&local_c0,(allocator<oout::FailureResult> *)&local_1e0,
             (char (*) [8])0x17cda4);
  local_b0.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::FailureResult>>
            (&local_b0.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestResult **)&local_b0,(allocator<oout::TestResult> *)&local_1e0,&local_c0);
  local_a0.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedResult,std::allocator<oout::NamedResult>,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            (&local_a0.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(NamedResult **)&local_a0,(allocator<oout::NamedResult> *)&local_1e0,
             (char (*) [10])0x17c1d4,&local_b0);
  local_90.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::OoutReportText,std::allocator<oout::OoutReportText>,std::shared_ptr<oout::NamedResult>>
            (&local_90.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(OoutReportText **)&local_90,(allocator<oout::OoutReportText> *)&local_1e0
             ,&local_a0);
  local_1e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[19]>
            (&local_1e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_1e0,(allocator<oout::ContainMatch> *)&local_d0,
             (char (*) [19])"FAILURE: Test name");
  local_d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[8]>
            (&local_d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_d0,(allocator<oout::ContainMatch> *)&local_e0,
             (char (*) [8])0x17cda4);
  local_e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[20]>
            (&local_e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_e0,(allocator<oout::ContainMatch> *)&local_1b0,
             (char (*) [20])"1 of 1 tests failed");
  local_1a0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[39],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            (&local_1a0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_1a0,(allocator<oout::NamedTest> *)&local_1b0,
             (char (*) [39])"OoutReportText should show failed test",&local_90,&local_1e0,&local_d0,
             &local_e0);
  local_120.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ErrorResult,std::allocator<oout::ErrorResult>,char_const(&)[6]>
            (&local_120.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ErrorResult **)&local_120,(allocator<oout::ErrorResult> *)&local_1f0,
             (char (*) [6])0x17cdd7);
  local_110.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::ErrorResult>>
            (&local_110.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(TestResult **)&local_110,(allocator<oout::TestResult> *)&local_1f0,&local_120);
  local_100.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedResult,std::allocator<oout::NamedResult>,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            (&local_100.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedResult **)&local_100,(allocator<oout::NamedResult> *)&local_1f0,
             (char (*) [10])0x17c1d4,&local_110);
  local_f0.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::OoutReportText,std::allocator<oout::OoutReportText>,std::shared_ptr<oout::NamedResult>>
            (&local_f0.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(OoutReportText **)&local_f0,(allocator<oout::OoutReportText> *)&local_1f0
             ,&local_100);
  local_1f0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[17]>
            (&local_1f0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_1f0,(allocator<oout::ContainMatch> *)&local_130,
             (char (*) [17])"ERROR: Test name");
  local_130.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[6]>
            (&local_130.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_130,(allocator<oout::ContainMatch> *)&local_140,
             (char (*) [6])0x17cdd7);
  local_140.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[20]>
            (&local_140.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_140,(allocator<oout::ContainMatch> *)&local_1c0,
             (char (*) [20])"1 of 1 tests failed");
  local_1b0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[38],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            (&local_1b0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_1b0,(allocator<oout::NamedTest> *)&local_1c0,
             (char (*) [38])"OoutReportText should show error test",&local_f0,&local_1f0,&local_130,
             &local_140);
  local_190.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ErrorResult,std::allocator<oout::ErrorResult>>
            (&local_190.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ErrorResult **)&local_190,(allocator<oout::ErrorResult> *)&local_200);
  local_180.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::ErrorResult>>
            (&local_180.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(TestResult **)&local_180,(allocator<oout::TestResult> *)&local_200,&local_190);
  local_170.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedResult,std::allocator<oout::NamedResult>,char_const(&)[18],std::shared_ptr<oout::TestResult>>
            (&local_170.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedResult **)&local_170,(allocator<oout::NamedResult> *)&local_200,
             (char (*) [18])0x17c257,&local_180);
  local_160.super___shared_ptr<oout::SuiteResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuiteResult,std::allocator<oout::SuiteResult>,std::shared_ptr<oout::NamedResult>>
            (&local_160.super___shared_ptr<oout::SuiteResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SuiteResult **)&local_160,(allocator<oout::SuiteResult> *)&local_200,
             &local_170);
  local_150.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::OoutReportText,std::allocator<oout::OoutReportText>,std::shared_ptr<oout::SuiteResult>>
            (&local_150.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(OoutReportText **)&local_150,
             (allocator<oout::OoutReportText> *)&local_200,&local_160);
  local_200.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[25]>
            (&local_200.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_200,(allocator<oout::ContainMatch> *)&local_201,
             (char (*) [25])"ERROR: Suite failed test");
  local_1c0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[39],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>>
            (&local_1c0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_1c0,(allocator<oout::NamedTest> *)&local_201,
             (char (*) [39])"OoutReportText should show suite tests",&local_150,&local_200);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_40,&local_50,&local_1a0,&local_1b0,&local_1c0);
  if (local_1c0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_200.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_200.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_160.super___shared_ptr<oout::SuiteResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.super___shared_ptr<oout::SuiteResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_180.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_190.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_140.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_130.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1f0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_100.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_110.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_120.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1a0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a0.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b0.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_c0.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d0.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_60.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<oout::OoutReportText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_80.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00197618;
  return;
}

Assistant:

OoutReportTextTest::OoutReportTextTest()
: dirty::Test(
	"OoutReportText tests",
	make_shared<NamedTest>(
		"OoutReportText should show summary string",
		make_shared<OoutReportText>(
			make_shared<TestResult>(make_shared<SuccessResult>())
		),
		make_shared<ContainMatch>("0 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show failed test",
		make_shared<OoutReportText>(
			make_shared<NamedResult>(
				"Test name",
				make_shared<TestResult>(make_shared<FailureResult>("failure"))
			)
		),
		make_shared<ContainMatch>("FAILURE: Test name"),
		make_shared<ContainMatch>("failure"),
		make_shared<ContainMatch>("1 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show error test",
		make_shared<OoutReportText>(
			make_shared<NamedResult>(
				"Test name",
				make_shared<TestResult>(make_shared<ErrorResult>("error"))
			)
		),
		make_shared<ContainMatch>("ERROR: Test name"),
		make_shared<ContainMatch>("error"),
		make_shared<ContainMatch>("1 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show suite tests",
		make_shared<OoutReportText>(
			make_shared<SuiteResult>(
				make_shared<NamedResult>(
					"Suite failed test",
					make_shared<TestResult>(make_shared<ErrorResult>())
				)
			)
		),
		make_shared<ContainMatch>("ERROR: Suite failed test")
	)
)
{
}